

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLcode Curl_SOCKS4(char *proxy_user,char *hostname,int remote_port,int sockindex,connectdata *conn
                    )

{
  curl_proxytype cVar1;
  curl_socket_t sockfd;
  Curl_easy *data;
  Curl_addrinfo *ai;
  CURLcode CVar2;
  int iVar3;
  timediff_t tVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  size_t len;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ssize_t written;
  int local_18c;
  char local_188 [2];
  undefined2 local_186;
  undefined4 local_184;
  char local_180;
  char acStack_17f [263];
  ssize_t actualread;
  
  cVar1 = (conn->socks_proxy).proxytype;
  sockfd = conn->sock[sockindex];
  data = conn->data;
  tVar4 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar4 < 0) {
    Curl_failf(data,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if ((conn->bits).httpproxy == true) {
    pcVar7 = "";
    if (cVar1 == CURLPROXY_SOCKS4A) {
      pcVar7 = "a";
    }
    Curl_infof(conn->data,"SOCKS4%s: connecting to HTTP proxy %s port %d\n",pcVar7,hostname,
               (ulong)(uint)remote_port);
  }
  curlx_nonblock(sockfd,0);
  Curl_infof(data,"SOCKS4 communication to %s:%d\n",hostname,(ulong)(uint)remote_port);
  local_188[0] = '\x04';
  local_188[1] = '\x01';
  local_186 = CONCAT11((char)remote_port,(char)((uint)remote_port >> 8));
  if (cVar1 != CURLPROXY_SOCKS4A) {
    iVar3 = Curl_resolv(conn,hostname,remote_port,(Curl_dns_entry **)&written);
    if (iVar3 == -1) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    if (iVar3 == 1) {
      Curl_resolver_wait_resolv(conn,(Curl_dns_entry **)&written);
    }
    if ((written == 0) || (ai = *(Curl_addrinfo **)written, ai == (Curl_addrinfo *)0x0)) {
LAB_0012ecb7:
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
    Curl_printable_address(ai,(char *)&actualread,0x40);
    local_18c = ai->ai_family;
    if (local_18c == 2) {
      local_184 = *(undefined4 *)(ai->ai_addr->sa_data + 2);
      Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)\n",&actualread);
    }
    else {
      Curl_failf(data,"SOCKS4 connection to %s not supported\n",&actualread);
    }
    Curl_resolv_unlock(data,(Curl_dns_entry *)written);
    if (local_18c != 2) goto LAB_0012ecb7;
  }
  local_180 = '\0';
  if (proxy_user != (char *)0x0) {
    sVar5 = strlen(proxy_user);
    if (0xfd < sVar5) {
      pcVar7 = "Too long SOCKS proxy name, can\'t use!\n";
      goto LAB_0012ec78;
    }
    memcpy(&local_180,proxy_user,sVar5 + 1);
  }
  sVar5 = strlen(&local_180);
  if (cVar1 == CURLPROXY_SOCKS4A) {
    local_184 = 0x1000000;
    sVar6 = strlen(hostname);
    if (0x106 < (long)(sVar6 + sVar5 + 9 + 1)) goto LAB_0012ebae;
    lVar9 = sVar6 + 1;
    strcpy(acStack_17f + sVar5,hostname);
  }
  else {
LAB_0012ebae:
    lVar9 = 0;
  }
  len = sVar5 + 9 + lVar9;
  CVar2 = Curl_write_plain(conn,sockfd,local_188,len,&written);
  if ((CVar2 == CURLE_OK) && (written == len)) {
    if (lVar9 == 0 && cVar1 == CURLPROXY_SOCKS4A) {
      sVar5 = strlen(hostname);
      CVar2 = Curl_write_plain(conn,sockfd,hostname,sVar5 + 1,&written);
      if ((CVar2 != CURLE_OK) || (written != sVar5 + 1)) goto LAB_0012ec5b;
    }
    iVar3 = Curl_blockread_all(conn,sockfd,local_188,8,&actualread);
    if ((iVar3 == 0) && (actualread == 8)) {
      if (local_188[0] == '\0') {
        uVar10 = (ulong)(byte)local_188[1];
        switch(local_188[1]) {
        case 'Z':
          pcVar7 = "";
          if (cVar1 == CURLPROXY_SOCKS4A) {
            pcVar7 = "a";
          }
          Curl_infof(data,"SOCKS4%s request granted.\n",pcVar7);
          curlx_nonblock(sockfd,1);
          return CURLE_OK;
        case '[':
          uVar8 = (ulong)(ushort)(local_186 << 8 | local_186 >> 8);
          pcVar7 = 
          "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed.";
          uVar10 = 0x5b;
          break;
        case '\\':
          uVar8 = (ulong)(ushort)(local_186 << 8 | local_186 >> 8);
          pcVar7 = 
          "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
          ;
          uVar10 = 0x5c;
          break;
        case ']':
          uVar8 = (ulong)(ushort)(local_186 << 8 | local_186 >> 8);
          pcVar7 = 
          "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
          ;
          uVar10 = 0x5d;
          break;
        default:
          uVar8 = (ulong)(ushort)(local_186 << 8 | local_186 >> 8);
          pcVar7 = "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.";
        }
        Curl_failf(data,pcVar7,(ulong)(byte)local_184,(ulong)local_184._1_1_,(ulong)local_184._2_1_,
                   (ulong)local_184._3_1_,uVar8,uVar10);
        return CURLE_COULDNT_CONNECT;
      }
      pcVar7 = "SOCKS4 reply has wrong version, version should be 4.";
    }
    else {
      pcVar7 = "Failed to receive SOCKS4 connect request ack.";
    }
  }
  else {
LAB_0012ec5b:
    pcVar7 = "Failed to send SOCKS4 connect request.";
  }
LAB_0012ec78:
  Curl_failf(data,pcVar7);
  return CURLE_COULDNT_CONNECT;
}

Assistant:

CURLcode Curl_SOCKS4(const char *proxy_user,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn)
{
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A) ? TRUE : FALSE;
#define SOCKS4REQLEN 262
  unsigned char socksreq[SOCKS4REQLEN]; /* room for SOCKS4 request incl. user
                                           id */
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct Curl_easy *data = conn->data;

  if(Curl_timeleft(data, NULL, TRUE) < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(conn->bits.httpproxy)
    infof(conn->data, "SOCKS4%s: connecting to HTTP proxy %s port %d\n",
          protocol4a ? "a" : "", hostname, remote_port);

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS4 communication to %s:%d\n", hostname, remote_port);

  /*
   * Compose socks4 request
   *
   * Request format
   *
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   * # of bytes:  1    1      2              4           variable       1
   */

  socksreq[0] = 4; /* version (SOCKS4) */
  socksreq[1] = 1; /* connect */
  socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
  socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

  /* DNS resolve only for SOCKS4, not SOCKS4a */
  if(!protocol4a) {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp = NULL;
    int rc;

    rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_PROXY;

    if(rc == CURLRESOLV_PENDING)
      /* ignores the return code, but 'dns' remains NULL on failure */
      (void)Curl_resolver_wait_resolv(conn, &dns);

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp = dns->addr;
    if(hp) {
      char buf[64];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(hp->ai_family == AF_INET) {
        struct sockaddr_in *saddr_in;

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)\n", buf);
      }
      else {
        hp = NULL; /* fail! */

        failf(data, "SOCKS4 connection to %s not supported\n", buf);
      }

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }

  /*
   * This is currently not supporting "Identification Protocol (RFC1413)".
   */
  socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
  if(proxy_user) {
    size_t plen = strlen(proxy_user);
    if(plen >= sizeof(socksreq) - 8) {
      failf(data, "Too long SOCKS proxy name, can't use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    /* copy the proxy name WITH trailing zero */
    memcpy(socksreq + 8, proxy_user, plen + 1);
  }

  /*
   * Make connection
   */
  {
    int result;
    ssize_t actualread;
    ssize_t written;
    ssize_t hostnamelen = 0;
    ssize_t packetsize = 9 +
      strlen((char *)socksreq + 8); /* size including NUL */

    /* If SOCKS4a, set special invalid IP address 0.0.0.x */
    if(protocol4a) {
      socksreq[4] = 0;
      socksreq[5] = 0;
      socksreq[6] = 0;
      socksreq[7] = 1;
      /* If still enough room in buffer, also append hostname */
      hostnamelen = (ssize_t)strlen(hostname) + 1; /* length including NUL */
      if(packetsize + hostnamelen <= SOCKS4REQLEN)
        strcpy((char *)socksreq + packetsize, hostname);
      else
        hostnamelen = 0; /* Flag: hostname did not fit in buffer */
    }

    /* Send request */
    code = Curl_write_plain(conn, sock, (char *)socksreq,
                            packetsize + hostnamelen,
                            &written);
    if(code || (written != packetsize + hostnamelen)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLE_COULDNT_CONNECT;
    }
    if(protocol4a && hostnamelen == 0) {
      /* SOCKS4a with very long hostname - send that name separately */
      hostnamelen = (ssize_t)strlen(hostname) + 1;
      code = Curl_write_plain(conn, sock, (char *)hostname, hostnamelen,
                              &written);
      if(code || (written != hostnamelen)) {
        failf(data, "Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }

    packetsize = 8; /* receive data size */

    /* Receive response */
    result = Curl_blockread_all(conn, sock, (char *)socksreq, packetsize,
                                &actualread);
    if(result || (actualread != packetsize)) {
      failf(data, "Failed to receive SOCKS4 connect request ack.");
      return CURLE_COULDNT_CONNECT;
    }

    /*
     * Response format
     *
     *     +----+----+----+----+----+----+----+----+
     *     | VN | CD | DSTPORT |      DSTIP        |
     *     +----+----+----+----+----+----+----+----+
     * # of bytes:  1    1      2              4
     *
     * VN is the version of the reply code and should be 0. CD is the result
     * code with one of the following values:
     *
     * 90: request granted
     * 91: request rejected or failed
     * 92: request rejected because SOCKS server cannot connect to
     *     identd on the client
     * 93: request rejected because the client program and identd
     *     report different user-ids
     */

    /* wrong version ? */
    if(socksreq[0] != 0) {
      failf(data,
            "SOCKS4 reply has wrong version, version should be 4.");
      return CURLE_COULDNT_CONNECT;
    }

    /* Result */
    switch(socksreq[1]) {
    case 90:
      infof(data, "SOCKS4%s request granted.\n", protocol4a?"a":"");
      break;
    case 91:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected or failed.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 92:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because SOCKS server cannot connect to "
            "identd on the client.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 93:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because the client program and identd "
            "report different user-ids.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    default:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", Unknown.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }
  }

  (void)curlx_nonblock(sock, TRUE);

  return CURLE_OK; /* Proxy was successful! */
}